

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# std_smart_pointers.cpp
# Opt level: O1

int main(void)

{
  CurrentAccount *ca;
  ostream *poVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  
  ca = (CurrentAccount *)operator_new(0x10);
  (ca->super_IBankAccount)._vptr_IBankAccount = (_func_int **)&PTR__IBankAccount_00103cb8;
  ca->m_balance = 200;
  poVar1 = operator<<((ostream *)&std::cout,ca);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  (*(ca->super_IBankAccount)._vptr_IBankAccount[1])(ca);
  this = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x20);
  this->_M_use_count = 1;
  this->_M_weak_count = 1;
  this->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00103d10;
  this[1]._vptr__Sp_counted_base = (_func_int **)&PTR__IBankAccount_00103cb8;
  this[1]._M_use_count = 200;
  poVar1 = operator<<((ostream *)&std::cout,(CurrentAccount *)(this + 1));
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  poVar1 = operator<<((ostream *)&std::cout,(CurrentAccount *)(this + 1));
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
  return 0;
}

Assistant:

int main()
{
	auto dumb_ptr{new CurrentAccount(100)};
	dumb_ptr->deposit(100);
	std::cout << *dumb_ptr << std::endl;
	delete dumb_ptr;

	auto smart_ptr{std::make_shared<CurrentAccount>(100)};
	smart_ptr->deposit(100);
	std::cout << *smart_ptr << std::endl;
	CurrentAccount* underlying_ptr{smart_ptr.get()};
	std::cout << *underlying_ptr << std::endl;

	return 0;
}